

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_refs.cpp
# Opt level: O0

void set_lt_cfg_to_frm(EncFrmStatus *frm,RefsCnt *lt_cfg)

{
  RefsCnt *lt_cfg_local;
  EncFrmStatus *frm_local;
  
  frm->val = frm->val & 0xffffffffffffffbf;
  frm->val = frm->val & 0xffffffffffffff7f | 0x80;
  frm->val = frm->val & 0xffffffffffff0fff | ((ulong)(uint)lt_cfg->tid & 0xf) << 0xc;
  frm->val = frm->val & 0xfffffffffffff0ff | ((ulong)(uint)lt_cfg->lt_idx & 0xf) << 8;
  if (lt_cfg->ref_mode != REF_TO_ST_REF_SETUP) {
    frm->val = frm->val & 0xffffffffffc0ffff | ((ulong)lt_cfg->ref_mode & 0x3f) << 0x10;
    frm->val = frm->val & 0xffffffffc03fffff | ((ulong)(uint)lt_cfg->ref_arg & 0xff) << 0x16;
  }
  if ((enc_refs_debug & 4) != 0) {
    _dump_frm(frm,"set_lt_cfg_to_frm",0x15f);
  }
  return;
}

Assistant:

static void set_lt_cfg_to_frm(EncFrmStatus *frm, RefsCnt *lt_cfg)
{
    frm->is_non_ref = 0;
    frm->is_lt_ref = 1;
    frm->temporal_id = lt_cfg->tid;
    frm->lt_idx = lt_cfg->lt_idx;

    if (lt_cfg->ref_mode != REF_TO_ST_REF_SETUP) {
        frm->ref_mode = lt_cfg->ref_mode;
        frm->ref_arg = lt_cfg->ref_arg;
    }

    if (enc_refs_debug & MPP_ENC_REFS_DBG_FRM)
        dump_frm(frm);
}